

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda_functions.cpp
# Opt level: O0

void duckdb::ListFilterFunctor::AppendResult
               (Vector *result,Vector *lambda_vector,idx_t elem_cnt,list_entry_t *result_entries,
               ListFilterInfo *info,LambdaExecuteInfo *execute_info)

{
  pointer puVar1;
  reference pvVar2;
  reference pvVar3;
  long in_RCX;
  UnifiedVectorFormat *in_RDX;
  ulong in_RSI;
  Vector *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_R8;
  long in_R9;
  bool bVar4;
  Vector result_lists;
  idx_t source_list_idx;
  idx_t entry_idx;
  idx_t i;
  ValidityMask *lambda_validity;
  bool *lambda_values;
  UnifiedVectorFormat lambda_data;
  SelectionVector sel;
  idx_t count;
  size_type in_stack_fffffffffffffe78;
  Vector *in_stack_fffffffffffffe80;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffe88;
  pointer puVar5;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  idx_t in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  Vector local_138 [104];
  ulong local_d0;
  idx_t local_c8;
  UnifiedVectorFormat *local_c0;
  undefined1 *local_b8;
  bool *local_b0;
  SelectionVector *local_98 [2];
  undefined1 auStack_88 [56];
  SelectionVector local_50;
  ulong local_38;
  long local_30;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_28;
  long local_20;
  UnifiedVectorFormat *local_18;
  ulong local_10;
  Vector *local_8;
  
  local_38 = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  SelectionVector::SelectionVector
            ((SelectionVector *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
             in_stack_fffffffffffffe98);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
  duckdb::Vector::ToUnifiedFormat(local_10,local_18);
  local_b0 = UnifiedVectorFormat::GetData<bool>((UnifiedVectorFormat *)local_98);
  local_b8 = auStack_88;
  for (local_c0 = (UnifiedVectorFormat *)0x0; local_c0 < local_18; local_c0 = local_c0 + 1) {
    local_c8 = SelectionVector::get_index(local_98[0],(idx_t)local_c0);
    while( true ) {
      puVar5 = local_28[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage;
      puVar1 = (pointer)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_28);
      bVar4 = false;
      if (puVar5 < puVar1) {
        pvVar2 = vector<unsigned_long,_true>::operator[]
                           ((vector<unsigned_long,_true> *)in_stack_fffffffffffffe80,
                            in_stack_fffffffffffffe78);
        bVar4 = *pvVar2 == 0;
      }
      if (!bVar4) break;
      *(pointer *)
       (local_20 +
       (long)local_28[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage * 0x10) =
           local_28[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      *(undefined8 *)
       (local_20 +
        (long)local_28[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage * 0x10 + 8) = 0;
      local_28[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)local_28[1].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 1);
    }
    bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_fffffffffffffe88,(idx_t)in_stack_fffffffffffffe80);
    if ((bVar4) && ((local_b0[local_c8] & 1U) != 0)) {
      local_38 = local_38 + 1;
      SelectionVector::set_index
                ((SelectionVector *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                 (idx_t)in_stack_fffffffffffffe88,(idx_t)in_stack_fffffffffffffe80);
      local_28[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)local_28[1].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start + 1);
    }
    local_28[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)local_28[2].
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start + 1);
    pvVar2 = vector<unsigned_long,_true>::operator[]
                       ((vector<unsigned_long,_true> *)in_stack_fffffffffffffe80,
                        in_stack_fffffffffffffe78);
    if ((pointer)*pvVar2 ==
        local_28[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      *(pointer *)
       (local_20 +
       (long)local_28[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage * 0x10) =
           local_28[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      *(pointer *)
       (local_20 +
        (long)local_28[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage * 0x10 + 8) =
           local_28[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_28[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)((long)local_28[1].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start +
                    (long)local_28[1].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish);
      local_28[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)local_28[1].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 1);
      local_28[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_28[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  while( true ) {
    puVar5 = local_28[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    puVar1 = (pointer)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_28);
    bVar4 = false;
    if (puVar5 < puVar1) {
      in_stack_fffffffffffffe80 =
           (Vector *)
           vector<unsigned_long,_true>::operator[]
                     ((vector<unsigned_long,_true> *)in_stack_fffffffffffffe80,
                      in_stack_fffffffffffffe78);
      bVar4 = *(value_type *)in_stack_fffffffffffffe80 == 0;
    }
    if (!bVar4) break;
    *(pointer *)
     (local_20 +
     (long)local_28[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage * 0x10) =
         local_28[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    *(undefined8 *)
     (local_20 +
      (long)local_28[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage * 0x10 + 8) = 0;
    local_28[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)local_28[1].
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 1);
  }
  local_d0 = (ulong)(*(byte *)(local_30 + 0x88) & 1);
  pvVar3 = vector<duckdb::Vector,_true>::operator[]
                     ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffe80,
                      in_stack_fffffffffffffe78);
  duckdb::Vector::Vector(local_138,pvVar3,&local_50,local_38);
  duckdb::ListVector::Append(local_8,local_138,local_38,0);
  Vector::~Vector(in_stack_fffffffffffffe80);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffe80);
  SelectionVector::~SelectionVector((SelectionVector *)0x80a315);
  return;
}

Assistant:

static void AppendResult(Vector &result, Vector &lambda_vector, const idx_t elem_cnt, list_entry_t *result_entries,
	                         ListFilterInfo &info, LambdaExecuteInfo &execute_info) {

		idx_t count = 0;
		SelectionVector sel(elem_cnt);
		UnifiedVectorFormat lambda_data;
		lambda_vector.ToUnifiedFormat(elem_cnt, lambda_data);

		auto lambda_values = UnifiedVectorFormat::GetData<bool>(lambda_data);
		auto &lambda_validity = lambda_data.validity;

		// compute the new lengths and offsets, and create a selection vector
		for (idx_t i = 0; i < elem_cnt; i++) {
			auto entry_idx = lambda_data.sel->get_index(i);

			// set length and offset of empty lists
			while (info.row_idx < info.entry_lengths.size() && !info.entry_lengths[info.row_idx]) {
				result_entries[info.row_idx].offset = info.offset;
				result_entries[info.row_idx].length = 0;
				info.row_idx++;
			}

			// found a true value
			if (lambda_validity.RowIsValid(entry_idx) && lambda_values[entry_idx]) {
				sel.set_index(count++, i);
				info.length++;
			}

			info.src_length++;

			// we traversed the entire source list
			if (info.entry_lengths[info.row_idx] == info.src_length) {
				// set the offset and length of the result entry
				result_entries[info.row_idx].offset = info.offset;
				result_entries[info.row_idx].length = info.length;

				// reset all other fields
				info.offset += info.length;
				info.row_idx++;
				info.length = 0;
				info.src_length = 0;
			}
		}

		// set length and offset of all remaining empty lists
		while (info.row_idx < info.entry_lengths.size() && !info.entry_lengths[info.row_idx]) {
			result_entries[info.row_idx].offset = info.offset;
			result_entries[info.row_idx].length = 0;
			info.row_idx++;
		}

		// slice the input chunk's corresponding vector to get the new lists
		// and append them to the result
		idx_t source_list_idx = execute_info.has_index ? 1 : 0;
		Vector result_lists(execute_info.input_chunk.data[source_list_idx], sel, count);
		ListVector::Append(result, result_lists, count, 0);
	}